

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O3

void shuff_build_codes(bit_io_t *bio,uint64_t *syms,uint64_t *freq,uint64_t n)

{
  uint64_t *puVar1;
  ulong *puVar2;
  uint64_t uVar3;
  uint64_t *puVar4;
  ulong *puVar5;
  long lVar6;
  ulong uVar7;
  uint64_t *puVar8;
  uint64_t *puVar9;
  ulong max_cw_length;
  uint64_t cw_lens [64];
  uint64_t local_238 [65];
  
  shuff_indirect_sort(freq,syms,syms,n);
  shuff_calculate_minimum_redundancy(freq,syms,n);
  max_cw_length = 0;
  local_238[0x38] = 0;
  local_238[0x39] = 0;
  local_238[0x3a] = 0;
  local_238[0x3b] = 0;
  local_238[0x3c] = 0;
  local_238[0x3d] = 0;
  local_238[0x3e] = 0;
  local_238[0x3f] = 0;
  local_238[0x30] = 0;
  local_238[0x31] = 0;
  local_238[0x32] = 0;
  local_238[0x33] = 0;
  local_238[0x34] = 0;
  local_238[0x35] = 0;
  local_238[0x36] = 0;
  local_238[0x37] = 0;
  local_238[0x28] = 0;
  local_238[0x29] = 0;
  local_238[0x2a] = 0;
  local_238[0x2b] = 0;
  local_238[0x2c] = 0;
  local_238[0x2d] = 0;
  local_238[0x2e] = 0;
  local_238[0x2f] = 0;
  local_238[0x20] = 0;
  local_238[0x21] = 0;
  local_238[0x22] = 0;
  local_238[0x23] = 0;
  local_238[0x24] = 0;
  local_238[0x25] = 0;
  local_238[0x26] = 0;
  local_238[0x27] = 0;
  local_238[0x18] = 0;
  local_238[0x19] = 0;
  local_238[0x1a] = 0;
  local_238[0x1b] = 0;
  local_238[0x1c] = 0;
  local_238[0x1d] = 0;
  local_238[0x1e] = 0;
  local_238[0x1f] = 0;
  local_238[0x10] = 0;
  local_238[0x11] = 0;
  local_238[0x12] = 0;
  local_238[0x13] = 0;
  local_238[0x14] = 0;
  local_238[0x15] = 0;
  local_238[0x16] = 0;
  local_238[0x17] = 0;
  local_238[8] = 0;
  local_238[9] = 0;
  local_238[10] = 0;
  local_238[0xb] = 0;
  local_238[0xc] = 0;
  local_238[0xd] = 0;
  local_238[0xe] = 0;
  local_238[0xf] = 0;
  local_238[0] = 0;
  local_238[1] = 0;
  local_238[2] = 0;
  local_238[3] = 0;
  local_238[4] = 0;
  local_238[5] = 0;
  local_238[6] = 0;
  local_238[7] = 0;
  puVar4 = syms;
  if (0 < (long)n) {
    do {
      uVar7 = freq[*puVar4];
      if (max_cw_length < uVar7) {
        max_cw_length = uVar7;
      }
      local_238[uVar7] = local_238[uVar7] + 1;
      puVar4 = puVar4 + 1;
    } while (puVar4 < syms + n);
  }
  shuff_build_canonical_arrays(local_238,max_cw_length);
  puVar2 = bio->out_u64;
  if (bio->buff_btg < 0x1c) {
    uVar7 = *puVar2 << (bio->buff_btg & 0x3f);
    puVar5 = puVar2 + 1;
    *puVar2 = uVar7;
    lVar6 = 0x25;
    *puVar2 = n >> ((ulong)(byte)(0x1b - (char)bio->buff_btg) & 0x3f) | uVar7;
    bio->out_u64 = puVar5;
    puVar2[1] = n;
  }
  else {
    *puVar2 = *puVar2 << 0x1b | n;
    lVar6 = -0x1b;
    puVar5 = puVar2;
  }
  uVar7 = lVar6 + bio->buff_btg;
  bio->buff_btg = uVar7;
  if (uVar7 < 7) {
    uVar7 = *puVar5 << (uVar7 & 0x3f);
    *puVar5 = uVar7;
    *puVar5 = max_cw_length >> ((ulong)(byte)(6 - (char)bio->buff_btg) & 0x3f) | uVar7;
    bio->out_u64 = puVar5 + 1;
    puVar5[1] = max_cw_length;
    lVar6 = 0x3a;
  }
  else {
    *puVar5 = *puVar5 << 6 | max_cw_length;
    lVar6 = -6;
  }
  bio->buff_btg = bio->buff_btg + lVar6;
  qsort(syms,n,8,shuff_pcmp);
  if (0 < (long)n) {
    puVar4 = bio->out_u64;
    puVar8 = syms;
    do {
      uVar3 = freq[*puVar8];
      puVar9 = puVar4;
      if (max_cw_length != uVar3 && -1 < (long)(max_cw_length - uVar3)) {
        lVar6 = (max_cw_length + 1) - uVar3;
        do {
          *puVar9 = *puVar9 << 1;
          puVar1 = &bio->buff_btg;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            puVar4 = puVar9 + 1;
            bio->out_u64 = puVar4;
            puVar9[1] = 0;
            bio->buff_btg = 0x40;
            puVar9 = puVar4;
          }
          lVar6 = lVar6 + -1;
        } while (1 < lVar6);
      }
      *puVar9 = *puVar9 * 2 + 1;
      puVar1 = &bio->buff_btg;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        puVar4 = puVar9 + 1;
        bio->out_u64 = puVar4;
        puVar9[1] = 0;
        bio->buff_btg = 0x40;
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 < syms + n);
  }
  shuff_interp_encode(bio,syms,n);
  shuff_generate_mapping(local_238,syms,freq,max_cw_length,n);
  return;
}

Assistant:

void shuff_build_codes(
    bit_io_t* bio, uint64_t* syms, uint64_t* freq, uint64_t n)
{
    uint64_t i;
    const uint64_t* p;
    uint64_t max_codeword_length; //, min_codeword_length;
    uint64_t cw_lens[SHUFF_L + 1];

    shuff_indirect_sort(freq, syms, syms, n);

    shuff_calculate_minimum_redundancy(freq, syms, n);

    // calculcate max_codeword_length and set cw_lens[]
    for (i = 0; i <= SHUFF_L; i++)
        cw_lens[i] = 0;
    // min_codeword_length = max_codeword_length = freq[syms[0]];
    max_codeword_length = 0;
    for (p = syms; p < syms + n; p++) {
        if (freq[*p] > max_codeword_length)
            max_codeword_length = freq[*p];
        cw_lens[freq[*p]]++;
    }

    shuff_build_canonical_arrays(cw_lens, max_codeword_length);

    SHUFF_OUTPUT_ULONG(bio, n, SHUFF_LOG2_MAX_SYMBOL);
    SHUFF_OUTPUT_ULONG(bio, max_codeword_length, SHUFF_LOG2_L);

    qsort(syms, n, sizeof(uint64_t), shuff_pcmp);

    for (p = syms; p < syms + n; p++) {
        SHUFF_OUTPUT_UNARY_CODE(bio, max_codeword_length - freq[*p]);
    }

    shuff_interp_encode(bio, syms, n);

    shuff_generate_mapping(cw_lens, syms, freq, max_codeword_length, n);
}